

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_copy_comp2img(fitsfile *infptr,fitsfile *outfptr,int norec,int *status)

{
  int iVar1;
  fitsfile *in_RCX;
  int in_EDX;
  char *spkeys [22] [2];
  char *reqkeys [11] [2];
  int nmore;
  int nkeys;
  int tstatus;
  int nsp;
  int nreq;
  int npat;
  int jj;
  int ii;
  char negative [2];
  char *patterns [40] [2];
  char card [81];
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffa9c;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffaa4;
  fitsfile *fptr;
  long local_548 [10];
  int *in_stack_fffffffffffffb08;
  char *in_stack_fffffffffffffb10;
  fitsfile *in_stack_fffffffffffffb18;
  int *in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  char *(*in_stack_fffffffffffffbc0) [2];
  undefined4 in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  fitsfile *in_stack_fffffffffffffbd0;
  fitsfile *in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc18;
  int *in_stack_fffffffffffffc20;
  int local_32c;
  int local_314;
  int local_310;
  undefined2 local_30a;
  long local_308 [22];
  long alStack_258 [41];
  undefined2 *local_110;
  char local_88 [96];
  fitsfile *local_28;
  int local_1c;
  int local_4;
  
  local_30a = 0x2d;
  local_28 = in_RCX;
  local_1c = in_EDX;
  memcpy(&stack0xfffffffffffffc18,&DAT_002c6650,0xb0);
  memcpy(local_548,&DAT_002c6700,0x160);
  if (local_28->HDUposition < 1) {
    for (local_310 = 0; local_310 < 0xb; local_310 = local_310 + 1) {
      local_308[(long)local_310 * 2] = *(long *)(&stack0xfffffffffffffc18 + (long)local_310 * 0x10);
      if (local_1c == 0) {
        local_308[(long)local_310 * 2 + 1] =
             *(long *)(&stack0xfffffffffffffc20 + (long)local_310 * 0x10);
      }
      else {
        local_308[(long)local_310 * 2 + 1] = (long)&local_30a;
      }
    }
    for (local_310 = 0; local_310 < 0x16; local_310 = local_310 + 1) {
      local_308[(long)(local_310 + 0xb) * 2] = local_548[(long)local_310 * 2];
      local_308[(long)(local_310 + 0xb) * 2 + 1] = local_548[(long)local_310 * 2 + 1];
    }
    ffgcrd((fitsfile *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
           (char *)in_stack_fffffffffffffbc0,
           (char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
           in_stack_fffffffffffffbb0);
    iVar1 = strncmp(local_88,"EXTNAME = \'COMPRESSED_IMAGE\'",0x1c);
    if (iVar1 == 0) {
      local_110 = &local_30a;
    }
    uVar2 = 0;
    uVar3 = 0;
    fptr = local_28;
    fits_translate_keywords
              (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc,
               in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,
               in_stack_fffffffffffffc10,in_stack_fffffffffffffc18,in_stack_fffffffffffffc20);
    ffghsp(fptr,(int *)CONCAT44(in_stack_fffffffffffffaa4,uVar3),
           (int *)CONCAT44(in_stack_fffffffffffffa9c,uVar2),(int *)0x2019ec);
    for (local_314 = 0; local_314 < local_32c / 0x24; local_314 = local_314 + 1) {
      for (local_310 = 0; local_310 < 0x24; local_310 = local_310 + 1) {
        ffprec(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      }
    }
    local_4 = local_28->HDUposition;
  }
  else {
    local_4 = local_28->HDUposition;
  }
  return local_4;
}

Assistant:

int imcomp_copy_comp2img(fitsfile *infptr, fitsfile *outfptr, 
                          int norec, int *status)
/*
    This routine copies the header keywords from the compressed input image 
    and to the uncompressed image (in a binary table) 
*/
{
    char card[FLEN_CARD];	/* a header record */
    char *patterns[40][2];
    char negative[] = "-";
    int ii,jj, npat, nreq, nsp, tstatus = 0;
    int nkeys, nmore;
    
    /* tile compressed image keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */

    /*  only translate these if required keywords not already written */
    char *reqkeys[][2] = {  
			   {"ZSIMPLE",   "SIMPLE" },  
			   {"ZTENSION", "XTENSION"},
			   {"ZBITPIX",   "BITPIX" },
			   {"ZNAXIS",    "NAXIS"  },
			   {"ZNAXISm",   "NAXISm" },
			   {"ZEXTEND",   "EXTEND" },
			   {"ZBLOCKED",  "BLOCKED"},
			   {"ZPCOUNT",   "PCOUNT" },  
			   {"ZGCOUNT",   "GCOUNT" },
			   {"ZHECKSUM",  "CHECKSUM"},  /* restore original checksums */
			   {"ZDATASUM",  "DATASUM"}}; 

    /* other special keywords */
    char *spkeys[][2] = {
			   {"XTENSION", "-"      },
			   {"BITPIX",  "-"       },
			   {"NAXIS",   "-"       },
			   {"NAXISm",  "-"       },
			   {"PCOUNT",  "-"       },
			   {"GCOUNT",  "-"       },
			   {"TFIELDS", "-"       },
			   {"TTYPEm",  "-"       },
			   {"TFORMm",  "-"       },
			   {"THEAP",   "-"       },
			   {"ZIMAGE",  "-"       },
			   {"ZQUANTIZ", "-"      },
			   {"ZDITHER0", "-"      },
			   {"ZTILEm",  "-"       },
			   {"ZCMPTYPE", "-"      },
			   {"ZBLANK",  "-"       },
			   {"ZNAMEm",  "-"       },
			   {"ZVALm",   "-"       },

			   {"CHECKSUM","-"       },  /* delete checksums */
			   {"DATASUM", "-"       },
			   {"EXTNAME", "+"       },  /* we may change this, below */
			   {"*",       "+"      }};  


    if (*status > 0)
        return(*status);
	
    nreq = sizeof(reqkeys)/sizeof(reqkeys[0][0])/2;
    nsp = sizeof(spkeys)/sizeof(spkeys[0][0])/2;

    /* construct translation patterns */

    for (ii = 0; ii < nreq; ii++) {
        patterns[ii][0] = reqkeys[ii][0];
	
        if (norec) 
            patterns[ii][1] = negative;
        else
            patterns[ii][1] = reqkeys[ii][1];
    }
    
    for (ii = 0; ii < nsp; ii++) {
        patterns[ii+nreq][0] = spkeys[ii][0];
        patterns[ii+nreq][1] = spkeys[ii][1];
    }

    npat = nreq + nsp;
    
    /* see if the EXTNAME keyword should be copied or not */
    fits_read_card(infptr, "EXTNAME", card, &tstatus);

    if (tstatus == 0) {
      if (!strncmp(card, "EXTNAME = 'COMPRESSED_IMAGE'", 28)) 
        patterns[npat-2][1] = negative;
    }
    
    /* translate and copy the keywords from the input file to the output */
    fits_translate_keywords(infptr, outfptr, 1, patterns, npat,
			    0, 0, 0, status);

    ffghsp(infptr, &nkeys, &nmore, status); /* get number of keywords in image */

    nmore = nmore / 36;  /* how many completely empty header blocks are there? */
     
    /* preserve the same number of spare header blocks in the output header */
     
    for (jj = 0; jj < nmore; jj++)
       for (ii = 0; ii < 36; ii++)
          fits_write_record(outfptr, "    ", status);


    return (*status);
}